

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llvm-cda-dump.cpp
# Opt level: O3

string * getInstName_abi_cxx11_(string *__return_storage_ptr__,Value *val)

{
  uint uVar1;
  raw_ostream *prVar2;
  _Base_ptr p_Var3;
  string *psVar4;
  size_t sVar5;
  char *pcVar6;
  _Base_ptr p_Var7;
  StringRef Str;
  StringRef Str_00;
  StringRef Str_01;
  raw_os_ostream ro;
  ostringstream ostr;
  code *local_1d8;
  undefined4 local_1d0;
  long local_1c8;
  undefined8 uStack_1c0;
  long local_1b8;
  undefined1 local_1b0;
  undefined8 local_1a8;
  undefined4 local_1a0;
  ostringstream *local_198;
  ostringstream local_190 [112];
  ios_base local_120 [264];
  
  std::__cxx11::ostringstream::ostringstream(local_190);
  local_1d0 = 0;
  local_1b0 = 0;
  local_1a8 = 0;
  local_1a0 = 1;
  local_1c8 = 0;
  uStack_1c0 = 0;
  local_1b8 = 0;
  local_1d8 = std::__throw_length_error;
  local_198 = local_190;
  if (dump_c_lines[0x80] == '\x01') {
    if (val == (Value *)0x0 || (byte)val[0x10] < 0x1b) {
      pcVar6 = "(no inst) ";
      sVar5 = 10;
    }
    else {
      if (*(long *)(val + 0x30) != 0) {
        uVar1 = llvm::DebugLoc::getLine();
        prVar2 = (raw_ostream *)
                 llvm::raw_ostream::operator<<((raw_ostream *)&local_1d8,(ulong)uVar1);
        Str.Length = 1;
        Str.Data = ":";
        prVar2 = llvm::raw_ostream::operator<<(prVar2,Str);
        uVar1 = llvm::DebugLoc::getCol();
LAB_0010f0f1:
        llvm::raw_ostream::operator<<(prVar2,(ulong)uVar1);
        goto LAB_0010f16d;
      }
      if (valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent != (_Base_ptr)0x0) {
        p_Var7 = &valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header;
        p_Var3 = valuesToVars._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
        do {
          if (*(Value **)(p_Var3 + 1) >= val) {
            p_Var7 = p_Var3;
          }
          p_Var3 = (&p_Var3->_M_left)[*(Value **)(p_Var3 + 1) < val];
        } while (p_Var3 != (_Base_ptr)0x0);
        if (((_Rb_tree_header *)p_Var7 != &valuesToVars._M_t._M_impl.super__Rb_tree_header) &&
           (*(Value **)(p_Var7 + 1) <= val)) {
          prVar2 = (raw_ostream *)
                   llvm::raw_ostream::operator<<
                             ((raw_ostream *)&local_1d8,(ulong)*(uint *)&p_Var7[2]._M_parent);
          Str_01.Length = 1;
          Str_01.Data = ":";
          prVar2 = llvm::raw_ostream::operator<<(prVar2,Str_01);
          uVar1 = *(uint *)((long)&p_Var7[2]._M_parent + 4);
          goto LAB_0010f0f1;
        }
      }
      pcVar6 = "(no dbg) ";
      sVar5 = 9;
    }
    Str_00.Length = sVar5;
    Str_00.Data = pcVar6;
    llvm::raw_ostream::operator<<((raw_ostream *)&local_1d8,Str_00);
  }
  else if (val[0x10] == (Value)0x0) {
    pcVar6 = (char *)llvm::Value::getName();
    llvm::raw_ostream::operator<<((raw_ostream *)&local_1d8,pcVar6);
    goto LAB_0010f16d;
  }
  llvm::Value::print((raw_ostream *)val,SUB81(&local_1d8,0));
LAB_0010f16d:
  if (local_1b8 != local_1c8) {
    llvm::raw_ostream::flush_nonempty();
  }
  std::__cxx11::stringbuf::str();
  llvm::raw_os_ostream::~raw_os_ostream((raw_os_ostream *)&local_1d8);
  std::__cxx11::ostringstream::~ostringstream(local_190);
  psVar4 = (string *)std::ios_base::~ios_base(local_120);
  return psVar4;
}

Assistant:

static std::string getInstName(const llvm::Value *val) {
    assert(val);
    std::ostringstream ostr;
    llvm::raw_os_ostream ro(ostr);

    if (dump_c_lines) {
        if (const auto *I = llvm::dyn_cast<llvm::Instruction>(val)) {
            const auto &DL = I->getDebugLoc();
            if (DL) {
                ro << DL.getLine() << ":" << DL.getCol();
            } else {
                auto Vit = valuesToVars.find(I);
                if (Vit != valuesToVars.end()) {
                    auto &decl = Vit->second;
                    ro << decl.line << ":" << decl.col;
                } else {
                    ro << "(no dbg) ";
                    ro << *val;
                }
            }
        } else {
            ro << "(no inst) ";
            ro << *val;
        }
        ro.flush();
        return ostr.str();
    }

    if (llvm::isa<llvm::Function>(val))
        ro << val->getName().data();
    else
        ro << *val;

    ro.flush();

    // break the string if it is too long
    return ostr.str();
}